

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::TermPass0
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,int depth)

{
  EncodedChar **p;
  byte bVar1;
  EncodedChar *pEVar2;
  EncodedChar *pEVar3;
  code *pcVar4;
  bool bVar5;
  EncodedChar EVar6;
  OLECHAR OVar7;
  CharCount CVar8;
  CharCount CVar9;
  undefined4 *puVar10;
  byte *pbVar11;
  ulong uVar12;
  HRESULT error;
  CharCount i;
  long lVar13;
  
  ThreadContext::ProbeStackNoDispose
            (this->scriptContext->threadContext,0x6000,this->scriptContext,(PVOID)0x0);
  pEVar2 = this->tempLocationOfSurrogatePair;
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar5) goto LAB_00ed92cb;
    *puVar10 = 0;
  }
  p = &this->next;
  pbVar11 = *p;
  bVar1 = *pbVar11;
  if (0x3e < bVar1) {
    if (0x7a < bVar1) {
      if (bVar1 != 0x7b) {
        if (bVar1 == 0x7c) goto switchD_00ed8737_caseD_29;
        if (bVar1 != 0x7d) goto switchD_00ed8737_caseD_25;
        goto switchD_00ed8613_caseD_5d;
      }
switchD_00ed8737_caseD_2a:
      bVar5 = AtQuantifier(this);
      if (!bVar5) {
        pbVar11 = this->next;
        goto switchD_00ed8737_caseD_2e;
      }
      error = -0x7ff5ec66;
      goto LAB_00ed88cb;
    }
    switch(bVar1) {
    case 0x5b:
      if (this->inputLim < pbVar11 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) goto LAB_00ed92cb;
        *puVar10 = 0;
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      if ((char)**p < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar5) goto LAB_00ed92cb;
        *puVar10 = 0;
      }
      pEVar3 = this->next;
      this->next = pEVar3 + 1;
      this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
      this->codePointAtTempLocation = 0;
      this->tempLocationOfRange = pEVar3 + 1;
      CharacterClassPass0(this);
      this->tempLocationOfRange = (EncodedChar *)0x0;
      ECMust(this,']',-0x7ff5ec65);
      break;
    case 0x5c:
      if (this->inputLim < pbVar11 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) goto LAB_00ed92cb;
        *puVar10 = 0;
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      if ((char)**p < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar5) goto LAB_00ed92cb;
        *puVar10 = 0;
      }
      this->next = this->next + 1;
      bVar5 = AtomEscapePass0(this);
      if (bVar5) {
        return;
      }
      break;
    case 0x5d:
switchD_00ed8613_caseD_5d:
      if (this->inputLim <= pbVar11) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x25d,"(!IsEOF())","!IsEOF()");
        if (!bVar5) goto LAB_00ed92cb;
        *puVar10 = 0;
      }
      UTF8EncodingPolicyBase<false>::ReadFull<true>
                (&this->super_UTF8EncodingPolicyBase<false>,p,this->inputLim);
      break;
    case 0x5e:
      goto switchD_00ed8613_caseD_5e;
    default:
      if (bVar1 != 0x3f) goto switchD_00ed8737_caseD_25;
      goto switchD_00ed8737_caseD_2a;
    }
    goto LAB_00ed8d81;
  }
  switch(bVar1) {
  case 0x24:
switchD_00ed8613_caseD_5e:
    if (this->inputLim < pbVar11 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar5) goto LAB_00ed92cb;
      *puVar10 = 0;
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    if (-1 < (char)**p) {
LAB_00ed87f2:
      *p = *p + 1;
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xd6,"(!this->IsMultiUnitChar(next[i]))","!this->IsMultiUnitChar(next[i])");
    if (bVar5) {
      *puVar10 = 0;
      goto LAB_00ed87f2;
    }
    goto LAB_00ed92cb;
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x2c:
  case 0x2d:
    goto switchD_00ed8737_caseD_25;
  case 0x28:
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    this->codePointAtTempLocation = 0;
    if (this->inputLim < pbVar11 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar5) goto LAB_00ed92cb;
      *puVar10 = 0;
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    if ((char)**p < '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd6,"(!this->IsMultiUnitChar(next[i]))","!this->IsMultiUnitChar(next[i])"
                        );
      if (!bVar5) goto LAB_00ed92cb;
      *puVar10 = 0;
    }
    pEVar2 = this->next;
    this->next = pEVar2 + 1;
    if (this->inputLim < pEVar2 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar5) goto LAB_00ed92cb;
      *puVar10 = 0;
    }
    if (**p == '?') {
      if (this->inputLim < *p + 2) {
        Fail(this,-0x7ff5ec67);
      }
      if (this->inputLim < this->next + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) goto LAB_00ed92cb;
        *puVar10 = 0;
      }
      uVar12 = (ulong)(*p)[1];
      if ((0x3d < uVar12) || ((0x2400000200000000U >> (uVar12 & 0x3f) & 1) == 0)) goto LAB_00ed9203;
      if (this->inputLim < *p + 2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) goto LAB_00ed92cb;
        *puVar10 = 0;
      }
      lVar13 = 0;
      do {
        if ((char)(*p)[lVar13] < '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                             "!this->IsMultiUnitChar(next[i])");
          if (!bVar5) goto LAB_00ed92cb;
          *puVar10 = 0;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 2);
      *p = *p + 2;
    }
    else {
LAB_00ed9203:
      this->numGroups = this->numGroups + 1;
    }
    DisjunctionPass0(this,depth + 1);
    ECMust(this,')',-0x7ff5ec64);
    goto LAB_00ed8da5;
  case 0x29:
switchD_00ed8737_caseD_29:
    error = -0x7ff5ec67;
LAB_00ed88cb:
    Fail(this,error);
    break;
  case 0x2a:
  case 0x2b:
    goto switchD_00ed8737_caseD_2a;
  case 0x2e:
switchD_00ed8737_caseD_2e:
    if (this->inputLim < pbVar11 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar5) goto LAB_00ed92cb;
      *puVar10 = 0;
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    if ((char)**p < '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd6,"(!this->IsMultiUnitChar(next[i]))","!this->IsMultiUnitChar(next[i])"
                        );
      if (!bVar5) goto LAB_00ed92cb;
      *puVar10 = 0;
    }
    *p = *p + 1;
    break;
  default:
    if ((bVar1 == 0) && (this->inputLim <= pbVar11)) {
      Fail(this,-0x7ff5ec67);
    }
switchD_00ed8737_caseD_25:
    pEVar3 = this->next;
    if (this->inputLim <= pEVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x25d,"(!IsEOF())","!IsEOF()");
      if (!bVar5) goto LAB_00ed92cb;
      *puVar10 = 0;
    }
    OVar7 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                      (&this->super_UTF8EncodingPolicyBase<false>,p,this->inputLim);
    if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
      TrackIfSurrogatePair(this,(uint)(ushort)OVar7,pEVar3,*(int *)&this->next - (int)pEVar3);
    }
  }
LAB_00ed8d81:
  if ((pEVar2 != (EncodedChar *)0x0) && (this->tempLocationOfSurrogatePair != (EncodedChar *)0x0)) {
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    this->codePointAtTempLocation = 0;
  }
LAB_00ed8da5:
  bVar5 = AtQuantifier(this);
  if (!bVar5) {
    return;
  }
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar5) goto LAB_00ed92cb;
    *puVar10 = 0;
  }
  pbVar11 = *p;
  bVar1 = *pbVar11;
  if (bVar1 - 0x2a < 2) {
LAB_00ed8e34:
    if (this->inputLim < pbVar11 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar5) goto LAB_00ed92cb;
      *puVar10 = 0;
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  }
  else {
    if (bVar1 != 0x7b) {
      if (bVar1 != 0x3f) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x51e,"(false)","false");
        if (bVar5) {
          *puVar10 = 0;
          return;
        }
        goto LAB_00ed92cb;
      }
      goto LAB_00ed8e34;
    }
    if (this->inputLim < pbVar11 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar5) goto LAB_00ed92cb;
      *puVar10 = 0;
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    if ((char)**p < '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd6,"(!this->IsMultiUnitChar(next[i]))","!this->IsMultiUnitChar(next[i])"
                        );
      if (!bVar5) goto LAB_00ed92cb;
      *puVar10 = 0;
    }
    this->next = this->next + 1;
    CVar8 = RepeatCount(this);
    if (this->inputLim < this->next) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar5) goto LAB_00ed92cb;
      *puVar10 = 0;
    }
    pEVar2 = *p;
    if (*pEVar2 != '}') {
      if (*pEVar2 == ',') {
        if (this->inputLim < pEVar2 + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar5) goto LAB_00ed92cb;
          *puVar10 = 0;
        }
        if ((char)**p < '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                             "!this->IsMultiUnitChar(next[i])");
          if (!bVar5) goto LAB_00ed92cb;
          *puVar10 = 0;
        }
        pEVar2 = this->next;
        this->next = pEVar2 + 1;
        if (this->inputLim < pEVar2 + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar5) goto LAB_00ed92cb;
          *puVar10 = 0;
        }
        if (**p != '}') {
          CVar9 = RepeatCount(this);
          if (CVar9 < CVar8) {
            Fail(this,-0x7ff5ec67);
          }
          EVar6 = ECLookahead(this,0);
          if (EVar6 != '}') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x50e,"(ECLookahead() == \'}\')","ECLookahead() == \'}\'");
            if (!bVar5) goto LAB_00ed92cb;
            *puVar10 = 0;
          }
        }
        ECConsume(this,1);
        goto LAB_00ed8ef4;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x518,"(false)","false");
      if (bVar5) {
        *puVar10 = 0;
        return;
      }
      goto LAB_00ed92cb;
    }
    if (this->inputLim < pEVar2 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar5) goto LAB_00ed92cb;
      *puVar10 = 0;
    }
  }
  if ((char)**p < '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xd6,"(!this->IsMultiUnitChar(next[i]))","!this->IsMultiUnitChar(next[i])");
    if (!bVar5) {
LAB_00ed92cb:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar10 = 0;
  }
  this->next = this->next + 1;
LAB_00ed8ef4:
  OptNonGreedy(this);
  return;
}

Assistant:

void Parser<P, IsLiteral>::TermPass0(int depth)
    {
        PROBE_STACK_NO_DISPOSE(scriptContext, Js::Constants::MinStackRegex);
        // Either we have a location at the start, or the end, never both. As in between it should have been cleared if surrogate pair
        // Or must be cleared if we didn't perform the check
        bool clearLocationIfPresent = this->tempLocationOfSurrogatePair != nullptr;

        switch (ECLookahead())
        {
        case '^':
        case '$':
            ECConsume();
            return;
        case '\\':
            ECConsume();
            if (AtomEscapePass0())
                return;
            break;
        case '(':
            // Can't combine into a single codeunit because of group present
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
            clearLocationIfPresent = false;
            ECConsume();
            switch (ECLookahead())
            {
            case '?':
                if (!ECCanConsume(2))
                    Fail(JSERR_RegExpSyntax);
                switch (ECLookahead(1))
                {
                case '=':
                case '!':
                case ':':
                    ECConsume(2);
                    break;
                default:
                    numGroups++;
                    break;
                }
                break;
            default:
                numGroups++;
                break;
            }
            DisjunctionPass0(depth + 1);
            ECMust(')', JSERR_RegExpNoParen);
            break;
        case '.':
            ECConsume();
            break;
        case '[':
            ECConsume();
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
            this->tempLocationOfRange = next;
            CharacterClassPass0();
            this->tempLocationOfRange = nullptr;
            ECMust(']', JSERR_RegExpNoBracket);
            break;
        case ')':
        case '|':
            Fail(JSERR_RegExpSyntax);
            break;
        case ']':
        case '}':
            NextChar();
            break;
        case '*':
        case '+':
        case '?':
        case '{':
            if (AtQuantifier())
                Fail(JSERR_RegExpBadQuant);
            else
                ECConsume();
            break;
        case 0:
            if (IsEOF())
                // Terminating 0
                Fail(JSERR_RegExpSyntax);
            // else fall-through for embedded 0
        default:
            {
                const EncodedChar* current = next;
                Char c = NextChar();
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    TrackIfSurrogatePair(c, current, (uint32)(next - current));
                }
                // Closing '/' in literals should be caught explicitly
                Assert(!IsLiteral || c != '/');
            }
            break;
        }

        if (clearLocationIfPresent && this->tempLocationOfSurrogatePair != nullptr)
        {
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
        }

        if (AtQuantifier())
        {
            switch (ECLookahead())
            {
            case '*':
            case '+':
            case '?':
                ECConsume();
                OptNonGreedy();
                break;
            case '{':
                {
                    ECConsume();
                    CharCount lower = RepeatCount();
                    switch (ECLookahead())
                    {
                    case ',':
                        ECConsume();
                        if (ECLookahead() == '}')
                        {
                            ECConsume();
                            OptNonGreedy();
                        }
                        else
                        {
                            CharCount upper = RepeatCount();
                            if (upper < lower)
                                Fail(JSERR_RegExpSyntax);
                            Assert(ECLookahead() == '}');
                            ECConsume();
                            OptNonGreedy();
                        }
                        break;
                    case '}':
                        ECConsume();
                        OptNonGreedy();
                        break;
                    default:
                        Assert(false);
                        break;
                    }
                    break;
                }
            default:
                Assert(false);
                break;
            }
        }
    }